

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbnf.cpp
# Opt level: O1

UBool __thiscall
icu_63::RuleBasedNumberFormat::operator==(RuleBasedNumberFormat *this,Format *other)

{
  char *__s1;
  char *__s2;
  bool bVar1;
  byte bVar2;
  UBool UVar3;
  int iVar4;
  uint uVar5;
  NFRuleSet *pNVar6;
  NFRuleSet *this_00;
  NFRuleSet **ppNVar7;
  
  if (this == (RuleBasedNumberFormat *)other) {
    return '\x01';
  }
  __s1 = *(char **)((this->super_NumberFormat).super_Format.super_UObject._vptr_UObject[-1] + 8);
  __s2 = *(char **)((other->super_UObject)._vptr_UObject[-1] + 8);
  if (__s1 != __s2) {
    if (*__s1 == '*') {
      return '\0';
    }
    iVar4 = strcmp(__s1,__s2);
    if (iVar4 != 0) {
      return '\0';
    }
  }
  bVar2 = Locale::operator==(&this->locale,(Locale *)(other[1].actualLocale + 0x38));
  uVar5 = (uint)bVar2;
  bVar1 = true;
  if ((bVar2 == 0) || (uVar5 = (uint)(byte)this->lenient, this->lenient != other[1].field_0x144))
  goto LAB_0022e714;
  if (this->localizations == (LocalizationInfo *)0x0) {
    uVar5 = (uint)(*(long *)other[2].actualLocale == 0);
  }
  else if (*(long *)other[2].actualLocale == 0) {
    uVar5 = 0;
  }
  else {
    iVar4 = (*this->localizations->_vptr_LocalizationInfo[2])();
    uVar5 = (uint)(char)iVar4;
  }
  if (uVar5 == 0) goto LAB_0022e714;
  ppNVar7 = this->fRuleSets;
  pNVar6 = *(NFRuleSet **)(other[1].actualLocale + 0x18);
  if (ppNVar7 == (NFRuleSet **)0x0) {
LAB_0022e736:
    uVar5 = (uint)(pNVar6 == (NFRuleSet *)0x0);
  }
  else {
    if (pNVar6 != (NFRuleSet *)0x0) {
      this_00 = *ppNVar7;
      while (((this_00 != (NFRuleSet *)0x0 && (*(NFRuleSet **)pNVar6 != (NFRuleSet *)0x0)) &&
             (UVar3 = NFRuleSet::operator==(this_00,*(NFRuleSet **)pNVar6), UVar3 != '\0'))) {
        pNVar6 = (NFRuleSet *)&pNVar6->name;
        this_00 = ppNVar7[1];
        ppNVar7 = ppNVar7 + 1;
      }
      uVar5 = 0;
      bVar1 = false;
      if (*(long *)pNVar6 != 0) goto LAB_0022e714;
      pNVar6 = *ppNVar7;
      goto LAB_0022e736;
    }
    uVar5 = 0;
  }
  bVar1 = false;
LAB_0022e714:
  if (bVar1) {
    return '\0';
  }
  return (UBool)uVar5;
}

Assistant:

UBool
RuleBasedNumberFormat::operator==(const Format& other) const
{
    if (this == &other) {
        return TRUE;
    }

    if (typeid(*this) == typeid(other)) {
        const RuleBasedNumberFormat& rhs = (const RuleBasedNumberFormat&)other;
        // test for capitalization info equality is adequately handled
        // by the NumberFormat test for fCapitalizationContext equality;
        // the info here is just derived from that.
        if (locale == rhs.locale &&
            lenient == rhs.lenient &&
            (localizations == NULL 
                ? rhs.localizations == NULL 
                : (rhs.localizations == NULL 
                    ? FALSE
                    : *localizations == rhs.localizations))) {

            NFRuleSet** p = fRuleSets;
            NFRuleSet** q = rhs.fRuleSets;
            if (p == NULL) {
                return q == NULL;
            } else if (q == NULL) {
                return FALSE;
            }
            while (*p && *q && (**p == **q)) {
                ++p;
                ++q;
            }
            return *q == NULL && *p == NULL;
        }
    }

    return FALSE;
}